

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

uint __thiscall
fmt::internal::ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::WidthHandler,_unsigned_int> *this,Arg *arg)

{
  uint uVar1;
  FormatError *this_00;
  ulong uVar2;
  
  switch(arg->type) {
  case INT:
  case CHAR:
    uVar1 = anon_unknown_1::WidthHandler::visit_any_int<int>
                      ((WidthHandler *)this,(arg->super_Value).field_0.int_value);
    return uVar1;
  case UINT:
    uVar1 = (arg->super_Value).field_0.int_value;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 0) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x1ec215);
LAB_001bcc39:
      __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
    }
    break;
  case LONG_LONG:
    uVar2 = (arg->super_Value).field_0.ulong_long_value;
    if ((long)uVar2 < 0) {
      *(undefined4 *)(this + 8) = 1;
      uVar2 = -uVar2;
    }
    if (uVar2 >> 0x1f != 0) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x1ec215);
      goto LAB_001bcc39;
    }
    break;
  case ULONG_LONG:
    uVar2 = (arg->super_Value).field_0.ulong_long_value;
    if ((uVar2 & 0xffffffff80000000) != 0) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x1ec215);
      goto LAB_001bcc39;
    }
    break;
  case BOOL:
    uVar2 = (ulong)((arg->super_Value).field_0.int_value != 0);
    break;
  case DOUBLE:
  case LAST_NUMERIC_TYPE:
  case CSTRING:
  case STRING:
  case WSTRING:
  case POINTER:
  case CUSTOM:
    visit_unhandled_arg(this);
  default:
    __assert_fail("(false) && \"invalid argument type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/cppformat/cppformat/format.h"
                  ,0x4f9,
                  "Result fmt::internal::ArgVisitor<fmt::(anonymous namespace)::WidthHandler, unsigned int>::visit(const Arg &) [Impl = fmt::(anonymous namespace)::WidthHandler, Result = unsigned int]"
                 );
  }
  return (uint)uVar2;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    default:
      FMT_ASSERT(false, "invalid argument type");
      return Result();
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
  }